

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_long>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_long> *this,ExceptionOr<unsigned_long> *result)

{
  ExceptionOr<unsigned_long> *pEVar1;
  ExceptionOr<unsigned_long> *result_local;
  ImmediatePromiseNode<unsigned_long> *this_local;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00d98090;
  pEVar1 = mv<kj::_::ExceptionOr<unsigned_long>>(result);
  ExceptionOr<unsigned_long>::ExceptionOr(&this->result,pEVar1);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}